

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O3

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::changeElement(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,int i,int j,
               number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *val,bool scale)

{
  uint *puVar1;
  bool bVar2;
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar3;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar4;
  Real a;
  undefined8 uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int *piVar9;
  char *pcVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  char *__filename;
  undefined7 in_register_00000081;
  long lVar14;
  long lVar15;
  long lVar16;
  Item *this_02;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  uint local_140;
  uint local_13c;
  Item *local_138;
  undefined4 local_12c;
  cpp_dec_float<50U,_int,_void> local_128;
  cpp_dec_float<50U,_int,_void> local_e8;
  uint local_a8 [2];
  uint auStack_a0 [2];
  uint local_98 [2];
  uint auStack_90 [2];
  uint local_88 [4];
  undefined8 local_78;
  undefined8 uStack_70;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  int local_40;
  undefined1 local_3c;
  undefined8 local_38;
  
  if ((j | i) < 0) {
    return;
  }
  local_12c = (undefined4)CONCAT71(in_register_00000081,scale);
  this_02 = (this->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.theitem +
            (this->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thekey[i].idx;
  local_138 = (this->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.theitem +
              (this->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thekey[j].idx;
  local_88._0_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 8);
  local_a8 = *(uint (*) [2])(val->m_backend).data._M_elems;
  auStack_a0 = *(uint (*) [2])((val->m_backend).data._M_elems + 2);
  local_98 = *(uint (*) [2])((val->m_backend).data._M_elems + 4);
  auStack_90 = *(uint (*) [2])((val->m_backend).data._M_elems + 6);
  iVar8 = (val->m_backend).exp;
  bVar2 = (val->m_backend).neg;
  local_78._0_4_ = (val->m_backend).fpclass;
  local_78._4_4_ = (val->m_backend).prec_elem;
  uStack_70 = 0;
  this_00 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  this_01 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  local_140 = j;
  local_13c = i;
  a = Tolerances::epsilon(this_00);
  local_e8.data._M_elems[8] = local_88[0];
  local_e8.data._M_elems[9] = local_88[1];
  local_e8.data._M_elems[4] = local_98[0];
  local_e8.data._M_elems[5] = local_98[1];
  local_e8.data._M_elems[6] = auStack_90[0];
  local_e8.data._M_elems[7] = auStack_90[1];
  local_e8.data._M_elems[0] = local_a8[0];
  local_e8.data._M_elems[1] = local_a8[1];
  uVar5 = local_e8.data._M_elems._0_8_;
  local_e8.data._M_elems[2] = auStack_a0[0];
  local_e8.data._M_elems[3] = auStack_a0[1];
  local_e8.fpclass = (fpclass_type)local_78;
  local_e8.prec_elem = local_78._4_4_;
  local_e8.neg = bVar2;
  if ((bVar2 != false) &&
     (local_e8.data._M_elems[0] = local_a8[0],
     local_e8.data._M_elems[0] != 0 || (fpclass_type)local_78 != cpp_dec_float_finite)) {
    local_e8.neg = (bool)(bVar2 ^ 1);
  }
  bVar2 = false;
  local_e8.data._M_elems._0_8_ = uVar5;
  local_e8.exp = iVar8;
  if (((fpclass_type)local_78 != cpp_dec_float_NaN) && (!NAN(a))) {
    local_128.fpclass = cpp_dec_float_finite;
    local_128.prec_elem = 10;
    local_128.data._M_elems[0] = 0;
    local_128.data._M_elems[1] = 0;
    local_128.data._M_elems[2] = 0;
    local_128.data._M_elems[3] = 0;
    local_128.data._M_elems[4] = 0;
    local_128.data._M_elems[5] = 0;
    local_128.data._M_elems._24_5_ = 0;
    local_128.data._M_elems[7]._1_3_ = 0;
    local_128.data._M_elems[8] = 0;
    local_128.data._M_elems[9] = 0;
    local_128.exp = 0;
    local_128.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_128,a);
    iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                      (&local_e8,&local_128);
    bVar2 = 0 < iVar8;
  }
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  uVar7 = local_13c;
  uVar6 = local_140;
  if (!bVar2) {
    pNVar3 = (this_02->data).
             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .m_elem;
    if (pNVar3 == (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x0) {
      return;
    }
    pcVar10 = (char *)(long)(this_02->data).
                            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .memused;
    if ((long)pcVar10 < 1) {
      return;
    }
    lVar14 = 0;
    while (*(uint *)((long)(&pNVar3->val + 1) + lVar14) != local_140) {
      lVar14 = lVar14 + 0x3c;
      if ((long)pcVar10 * 0x3c - lVar14 == 0) {
        return;
      }
    }
    pNVar4 = (local_138->data).
             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .m_elem;
    if (pNVar4 == (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x0) {
      return;
    }
    lVar14 = (long)(local_138->data).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .memused;
    if (lVar14 < 1) {
      return;
    }
    lVar15 = 0;
    while (*(uint *)((long)(&pNVar4->val + 1) + lVar15) != local_13c) {
      lVar15 = lVar15 + 0x3c;
      if (lVar14 * 0x3c - lVar15 == 0) {
        return;
      }
    }
    piVar9 = &pNVar3->idx;
    __filename = (char *)0x0;
    do {
      if (*piVar9 == local_140) goto LAB_0026fbc5;
      __filename = __filename + 1;
      piVar9 = piVar9 + 0xf;
    } while (pcVar10 != __filename);
    __filename = (char *)0xffffffff;
LAB_0026fbc5:
    SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::remove((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)this_02,__filename);
    pNVar3 = (local_138->data).
             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .m_elem;
    pcVar10 = (char *)0xffffffff;
    if ((pNVar3 != (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)0x0) &&
       (uVar11 = (ulong)(local_138->data).
                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .memused, 0 < (long)uVar11)) {
      piVar9 = &pNVar3->idx;
      uVar12 = 0;
      do {
        if (*piVar9 == uVar7) {
          pcVar10 = (char *)(uVar12 & 0xffffffff);
          break;
        }
        uVar12 = uVar12 + 1;
        piVar9 = piVar9 + 0xf;
      } while (uVar11 != uVar12);
    }
    SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::remove((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)local_138,pcVar10);
    return;
  }
  local_128.data._M_elems[4] = 0;
  local_128.data._M_elems[5] = 0;
  local_128.data._M_elems._24_5_ = 0;
  local_128.data._M_elems[7]._1_3_ = 0;
  local_128.data._M_elems._0_16_ = ZEXT816(0);
  local_128.data._M_elems[8] = 0;
  local_128.data._M_elems[9] = 0;
  if ((char)local_12c == '\0') {
    local_128.data._M_elems._32_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 8);
    local_128.data._M_elems._0_8_ = *(undefined8 *)(val->m_backend).data._M_elems;
    local_128.data._M_elems._8_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 2);
    local_128.data._M_elems._16_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 4);
    uVar5 = *(undefined8 *)((val->m_backend).data._M_elems + 6);
    local_128.data._M_elems._24_5_ = SUB85(uVar5,0);
    local_128.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
    local_128.exp = (val->m_backend).exp;
    local_128.neg = (val->m_backend).neg;
    local_128.fpclass = (val->m_backend).fpclass;
    local_128.prec_elem = (val->m_backend).prec_elem;
  }
  else {
    local_68 = (val->m_backend).data._M_elems[0];
    uStack_64 = (val->m_backend).data._M_elems[1];
    uStack_60 = (val->m_backend).data._M_elems[2];
    uStack_5c = (val->m_backend).data._M_elems[3];
    local_58 = *(undefined8 *)((val->m_backend).data._M_elems + 4);
    uStack_50 = *(undefined8 *)((val->m_backend).data._M_elems + 6);
    local_48 = *(undefined8 *)((val->m_backend).data._M_elems + 8);
    local_40 = (val->m_backend).exp;
    local_3c = (val->m_backend).neg;
    local_38._0_4_ = (val->m_backend).fpclass;
    local_38._4_4_ = (val->m_backend).prec_elem;
    (*this->lp_scaler->_vptr_SPxScaler[0x2a])
              (&local_e8,this->lp_scaler,this,(ulong)local_13c,(ulong)local_140);
    local_128.data._M_elems[8] = local_e8.data._M_elems[8];
    local_128.data._M_elems[9] = local_e8.data._M_elems[9];
    local_128.data._M_elems[4] = local_e8.data._M_elems[4];
    local_128.data._M_elems[5] = local_e8.data._M_elems[5];
    local_128.data._M_elems._24_5_ = local_e8.data._M_elems._24_5_;
    local_128.data._M_elems[7]._1_3_ = local_e8.data._M_elems[7]._1_3_;
    local_128.data._M_elems[0] = local_e8.data._M_elems[0];
    local_128.data._M_elems[1] = local_e8.data._M_elems[1];
    local_128.data._M_elems[2] = local_e8.data._M_elems[2];
    local_128.data._M_elems[3] = local_e8.data._M_elems[3];
    local_128.exp = local_e8.exp;
    local_128.neg = local_e8.neg;
    local_128.fpclass = local_e8.fpclass;
    local_128.prec_elem = local_e8.prec_elem;
  }
  pNVar3 = (this_02->data).
           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .m_elem;
  if ((pNVar3 != (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)0x0) &&
     (lVar14 = (long)(this_02->data).
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .memused, 0 < lVar14)) {
    lVar15 = 0;
    do {
      if (*(uint *)((long)(&pNVar3->val + 1) + lVar15) == uVar6) {
        pNVar4 = (local_138->data).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .m_elem;
        if ((pNVar4 != (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)0x0) &&
           (lVar15 = (long)(local_138->data).
                           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .memused, 0 < lVar15)) {
          lVar13 = 0;
          goto LAB_0026fb43;
        }
        break;
      }
      lVar15 = lVar15 + 0x3c;
    } while (lVar14 * 0x3c - lVar15 != 0);
  }
  goto LAB_0026fb57;
  while( true ) {
    lVar15 = lVar15 + 1;
    piVar9 = piVar9 + 0xf;
    if (lVar14 == lVar15) break;
LAB_0026fc1b:
    if (*piVar9 == uVar6) goto LAB_0026fc33;
  }
  lVar15 = -1;
LAB_0026fc33:
  *(undefined8 *)(pNVar3[lVar15].val.m_backend.data._M_elems + 8) = local_128.data._M_elems._32_8_;
  puVar1 = pNVar3[lVar15].val.m_backend.data._M_elems + 4;
  *(undefined8 *)puVar1 = local_128.data._M_elems._16_8_;
  *(ulong *)(puVar1 + 2) = CONCAT35(local_128.data._M_elems[7]._1_3_,local_128.data._M_elems._24_5_)
  ;
  *(undefined8 *)pNVar3[lVar15].val.m_backend.data._M_elems = local_128.data._M_elems._0_8_;
  *(undefined8 *)(pNVar3[lVar15].val.m_backend.data._M_elems + 2) = local_128.data._M_elems._8_8_;
  pNVar3[lVar15].val.m_backend.exp = local_128.exp;
  pNVar3[lVar15].val.m_backend.neg = local_128.neg;
  pNVar3[lVar15].val.m_backend.fpclass = local_128.fpclass;
  pNVar3[lVar15].val.m_backend.prec_elem = local_128.prec_elem;
  pNVar3 = (local_138->data).
           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .m_elem;
  lVar15 = -1;
  lVar14 = lVar15;
  if ((pNVar3 != (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)0x0) &&
     (lVar13 = (long)(local_138->data).
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .memused, 0 < lVar13)) {
    piVar9 = &pNVar3->idx;
    lVar16 = 0;
    do {
      lVar14 = lVar16;
      if (*piVar9 == local_13c) break;
      lVar16 = lVar16 + 1;
      piVar9 = piVar9 + 0xf;
      lVar14 = lVar15;
    } while (lVar13 != lVar16);
  }
  *(undefined8 *)(pNVar3[lVar14].val.m_backend.data._M_elems + 8) = local_128.data._M_elems._32_8_;
  puVar1 = pNVar3[lVar14].val.m_backend.data._M_elems + 4;
  *(undefined8 *)puVar1 = local_128.data._M_elems._16_8_;
  *(ulong *)(puVar1 + 2) = CONCAT35(local_128.data._M_elems[7]._1_3_,local_128.data._M_elems._24_5_)
  ;
  *(undefined8 *)pNVar3[lVar14].val.m_backend.data._M_elems = local_128.data._M_elems._0_8_;
  *(undefined8 *)(pNVar3[lVar14].val.m_backend.data._M_elems + 2) = local_128.data._M_elems._8_8_;
  pNVar3[lVar14].val.m_backend.exp = local_128.exp;
  pNVar3[lVar14].val.m_backend.neg = local_128.neg;
  pNVar3[lVar14].val.m_backend.fpclass = local_128.fpclass;
  pNVar3[lVar14].val.m_backend.prec_elem = local_128.prec_elem;
  return;
  while (lVar13 = lVar13 + 0x3c, lVar15 * 0x3c - lVar13 != 0) {
LAB_0026fb43:
    if (*(uint *)((long)(&pNVar4->val + 1) + lVar13) == local_13c) {
      piVar9 = &pNVar3->idx;
      lVar15 = 0;
      goto LAB_0026fc1b;
    }
  }
LAB_0026fb57:
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::add2(&this->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ,local_13c,1,(int *)&local_140,
         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *)&local_128);
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::add2(&this->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ,local_140,1,(int *)&local_13c,
         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *)&local_128);
  return;
}

Assistant:

virtual void changeElement(int i, int j, const R& val, bool scale = false)
   {
      if(i < 0 || j < 0)
         return;

      SVectorBase<R>& row = rowVector_w(i);
      SVectorBase<R>& col = colVector_w(j);

      if(isNotZero(val, this->tolerances()->epsilon()))
      {
         R newVal;

         if(scale)
         {
            assert(_isScaled);
            assert(lp_scaler);
            newVal = lp_scaler->scaleElement(*this, i, j, val);
         }
         else
            newVal = val;

         if(row.pos(j) >= 0 && col.pos(i) >= 0)
         {
            row.value(row.pos(j)) = newVal;
            col.value(col.pos(i)) = newVal;
         }
         else
         {
            LPRowSetBase<R>::add2(i, 1, &j, &newVal);
            LPColSetBase<R>::add2(j, 1, &i, &newVal);
         }
      }
      else if(row.pos(j) >= 0 && col.pos(i) >= 0)
      {
         row.remove(row.pos(j));
         col.remove(col.pos(i));
      }

      assert(isConsistent());
   }